

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

void __thiscall QPDF::createFromJSON(QPDF *this,shared_ptr<InputSource> *is)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<InputSource> local_20;
  
  iVar1 = (*((is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_InputSource[3])();
  processMemoryFile(this,*(char **)CONCAT44(extraout_var,iVar1),
                    "%PDF-1.3\nxref\n0 1\n0000000000 65535 f \ntrailer << /Size 1 >>\nstartxref\n9\n%%EOF\n"
                    ,0x4e,(char *)0x0);
  local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (is->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  importJSON(this,&local_20,true);
  if (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return;
  }
  return;
}

Assistant:

void
QPDF::createFromJSON(std::shared_ptr<InputSource> is)
{
    processMemoryFile(is->getName().c_str(), JSON_PDF, strlen(JSON_PDF));
    importJSON(is, true);
}